

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_1000_1999.cpp
# Opt level: O2

void __thiscall psy::C::DeclarationBinderTester::case1135(DeclarationBinderTester *this)

{
  Decl *pDVar1;
  Ty *pTVar2;
  Expectation *pEVar3;
  socklen_t __len;
  allocator<char> local_6fe;
  allocator<char> local_6fd;
  allocator<char> local_6fc;
  allocator<char> local_6fb;
  allocator<char> local_6fa;
  allocator<char> local_6f9;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658 [32];
  Expectation local_638;
  Expectation local_580;
  Decl local_4c8;
  Decl local_400;
  Decl local_338;
  Decl local_270;
  Decl local_1a8;
  Decl local_e0;
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_658,"int ( * x ) ( y , char ) ;",&local_6f9);
  Expectation::Expectation(&local_638);
  Decl::Decl(&local_1a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_678,"x",&local_6fa);
  pDVar1 = Decl::Object(&local_1a8,&local_678,VariableDeclaration,File);
  pDVar1 = Ty::Basic(&pDVar1->ty_,Int_S,None);
  pDVar1 = Ty::Derived(&pDVar1->ty_,Function,None,None);
  pTVar2 = Ty::addParam(&pDVar1->ty_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_698,"y",&local_6fb);
  pDVar1 = Ty::Typedef(pTVar2,&local_698,None);
  pTVar2 = Ty::addParam(&pDVar1->ty_);
  pDVar1 = Ty::Basic(pTVar2,Char,None);
  pDVar1 = Ty::Derived(&pDVar1->ty_,Pointer,None,None);
  Decl::Decl(&local_e0,pDVar1);
  pEVar3 = Expectation::declaration(&local_638,&local_e0);
  Decl::Decl(&local_338);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b8,"",&local_6fc);
  pDVar1 = Decl::Object(&local_338,&local_6b8,ParameterDeclaration,FunctionPrototype);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d8,"y",&local_6fd);
  pDVar1 = Ty::Typedef(&pDVar1->ty_,&local_6d8,None);
  Decl::Decl(&local_270,pDVar1);
  pEVar3 = Expectation::declaration(pEVar3,&local_270);
  Decl::Decl(&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f8,"",&local_6fe);
  __len = 2;
  pDVar1 = Decl::Object(&local_4c8,&local_6f8,ParameterDeclaration,FunctionPrototype);
  pDVar1 = Ty::Basic(&pDVar1->ty_,Char,None);
  Decl::Decl(&local_400,pDVar1);
  pEVar3 = Expectation::declaration(pEVar3,&local_400);
  Expectation::Expectation(&local_580,pEVar3);
  bind(this,(int)local_658,(sockaddr *)&local_580,__len);
  Expectation::~Expectation(&local_580);
  Decl::~Decl(&local_400);
  std::__cxx11::string::~string((string *)&local_6f8);
  Decl::~Decl(&local_4c8);
  Decl::~Decl(&local_270);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::__cxx11::string::~string((string *)&local_6b8);
  Decl::~Decl(&local_338);
  Decl::~Decl(&local_e0);
  std::__cxx11::string::~string((string *)&local_698);
  std::__cxx11::string::~string((string *)&local_678);
  Decl::~Decl(&local_1a8);
  Expectation::~Expectation(&local_638);
  std::__cxx11::string::~string(local_658);
  return;
}

Assistant:

void DeclarationBinderTester::case1135()
{
    bind("int ( * x ) ( y , char ) ;",
         Expectation()
             .declaration(Decl()
                      .Object("x", SymbolKind::VariableDeclaration)
                      .ty_.Basic(BasicTypeKind::Int_S)
                      .ty_.Derived(TypeKind::Function)
                      .ty_.addParam().Typedef("y")
                      .ty_.addParam().Basic(BasicTypeKind::Char)
                      .ty_.Derived(TypeKind::Pointer))
         .declaration(Decl()
                 .Object("", SymbolKind::ParameterDeclaration, ScopeKind::FunctionPrototype)
                 .ty_.Typedef("y"))
         .declaration(Decl()
                 .Object("", SymbolKind::ParameterDeclaration, ScopeKind::FunctionPrototype)
                 .ty_.Basic(BasicTypeKind::Char)));
}